

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

bool __thiscall Minisat::Solver::addClause_(Solver *this,vec<Minisat::Lit,_int> *ps)

{
  byte bVar1;
  uint uVar2;
  Lit *pLVar3;
  lbool *plVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  CRef CVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  byte bVar15;
  uint uVar16;
  CRef cr;
  CRef local_34;
  
  uVar10 = 0;
  if (this->ok == true) {
    sort<Minisat::Lit,Minisat::LessThan_default<Minisat::Lit>>(ps->data,ps->sz);
    bVar8 = l_False;
    bVar7 = l_True;
    iVar14 = ps->sz;
    if (0 < iVar14) {
      pLVar3 = ps->data;
      plVar4 = (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.
               data;
      bVar6 = l_True & 2;
      bVar5 = l_False & 2;
      lVar11 = 0;
      uVar16 = 0xfffffffe;
      iVar12 = 0;
      do {
        uVar2 = pLVar3[lVar11].x;
        bVar1 = plVar4[(int)uVar2 >> 1].value;
        bVar15 = (byte)uVar2 & 1 ^ bVar1;
        uVar10 = 1;
        if ((bVar15 == bVar7 && bVar6 == 0 || (bVar1 & bVar7 & 2) != 0) || ((uVar2 ^ uVar16) == 1))
        goto LAB_00629a25;
        if (((bVar15 != bVar8 || bVar5 != 0) && (bVar1 & bVar8 & 2) == 0) && (uVar2 != uVar16)) {
          lVar13 = (long)iVar12;
          iVar12 = iVar12 + 1;
          pLVar3[lVar13].x = uVar2;
          uVar16 = uVar2;
        }
        lVar11 = lVar11 + 1;
        iVar14 = ps->sz;
      } while (lVar11 < iVar14);
      uVar10 = (int)lVar11 - iVar12;
    }
    if (0 < (int)uVar10) {
      ps->sz = iVar14 - uVar10;
    }
    if (ps->sz == 1) {
      iVar14 = ps->data->x;
      (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.data
      [iVar14 >> 1].value = (byte)iVar14 & 1;
      (this->vardata).super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map
      .data[iVar14 >> 1] = (VarData)((ulong)(uint)(this->trail_lim).sz << 0x20 | 0xffffffff);
      iVar12 = (this->trail).sz;
      (this->trail).sz = iVar12 + 1;
      (this->trail).data[iVar12].x = iVar14;
      CVar9 = propagate(this);
      uVar10 = (uint)(CVar9 == 0xffffffff);
      this->ok = CVar9 == 0xffffffff;
    }
    else if (ps->sz == 0) {
      this->ok = false;
      uVar10 = 0;
    }
    else {
      local_34 = ClauseAllocator::alloc(&this->ca,ps,false);
      vec<unsigned_int,_int>::push(&this->clauses,&local_34);
      attachClause(this,local_34);
      uVar10 = 1;
    }
  }
LAB_00629a25:
  return SUB41(uVar10,0);
}

Assistant:

bool Solver::addClause_(vec<Lit>& ps)
{
    assert(decisionLevel() == 0);
    if (!ok) return false;

    // Check if clause is satisfied and remove false/duplicate literals:
    sort(ps);
    Lit p; int i, j;
    for (i = j = 0, p = lit_Undef; i < ps.size(); i++)
        if (value(ps[i]) == l_True || ps[i] == ~p)
            return true;
        else if (value(ps[i]) != l_False && ps[i] != p)
            ps[j++] = p = ps[i];
    ps.shrink(i - j);

    if (ps.size() == 0)
        return ok = false;
    else if (ps.size() == 1){
        uncheckedEnqueue(ps[0]);
        return ok = (propagate() == CRef_Undef);
    }else{
        CRef cr = ca.alloc(ps, false);
        clauses.push(cr);
        attachClause(cr);
    }

    return true;
}